

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

char * ImPlot::GetColormapName(ImPlotColormap colormap)

{
  char *pcVar1;
  ImPlotContext *gp;
  ImPlotColormap colormap_local;
  
  pcVar1 = ImPlotColormapData::GetName(&GImPlot->ColormapData,colormap);
  return pcVar1;
}

Assistant:

const char* GetColormapName(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    return gp.ColormapData.GetName(colormap);
}